

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O0

void FAudioVoice_GetOutputFilterParameters
               (FAudioVoice *voice,FAudioVoice *pDestinationVoice,
               FAudioFilterParameters *pParameters)

{
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  uint32_t i;
  uint local_1c;
  long local_10;
  
  if (*(int *)(in_RDI + 0xc) != 2) {
    FAudio_PlatformLockMutex((FAudioMutex)0x128024);
    local_10 = in_RSI;
    if ((in_RSI == 0) && (*(int *)(in_RDI + 0x10) == 1)) {
      local_10 = *(long *)(*(long *)(in_RDI + 0x14) + 4);
    }
    local_1c = 0;
    while ((local_1c < *(uint *)(in_RDI + 0x10) &&
           (local_10 != *(long *)(*(long *)(in_RDI + 0x14) + (ulong)local_1c * 0xc + 4)))) {
      local_1c = local_1c + 1;
    }
    if (local_1c < *(uint *)(in_RDI + 0x10)) {
      if ((*(uint *)(*(long *)(in_RDI + 0x14) + (ulong)local_1c * 0xc) & 0x80) == 0) {
        FAudio_PlatformUnlockMutex((FAudioMutex)0x1280e1);
      }
      else {
        SDL_memcpy(in_RDX,*(long *)(in_RDI + 0x38) + (ulong)local_1c * 0xc,0xc);
        FAudio_PlatformUnlockMutex((FAudioMutex)0x128117);
      }
    }
    else {
      FAudio_PlatformUnlockMutex((FAudioMutex)0x1280ae);
    }
  }
  return;
}

Assistant:

void FAudioVoice_GetOutputFilterParameters(
	FAudioVoice *voice,
	FAudioVoice *pDestinationVoice,
	FAudioFilterParameters *pParameters
) {
	uint32_t i;

	LOG_API_ENTER(voice->audio)

	/* MSDN: "This method is usable only on source and submix voices and
	 * has no effect on mastering voices."
	 */
	if (voice->type == FAUDIO_VOICE_MASTER)
	{
		LOG_API_EXIT(voice->audio)
		return;
	}

	FAudio_PlatformLockMutex(voice->sendLock);
	LOG_MUTEX_LOCK(voice->audio, voice->sendLock)

	/* Find the send index */
	if (pDestinationVoice == NULL && voice->sends.SendCount == 1)
	{
		pDestinationVoice = voice->sends.pSends[0].pOutputVoice;
	}
	for (i = 0; i < voice->sends.SendCount; i += 1)
	{
		if (pDestinationVoice == voice->sends.pSends[i].pOutputVoice)
		{
			break;
		}
	}
	if (i >= voice->sends.SendCount)
	{
		LOG_ERROR(
			voice->audio,
			"Destination not attached to source: %p %p",
			(void*) voice,
			(void*) pDestinationVoice
		)
		FAudio_PlatformUnlockMutex(voice->sendLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
		LOG_API_EXIT(voice->audio)
		return;
	}

	if (!(voice->sends.pSends[i].Flags & FAUDIO_SEND_USEFILTER))
	{
		FAudio_PlatformUnlockMutex(voice->sendLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
		LOG_API_EXIT(voice->audio)
		return;
	}

	/* Set the filter parameters, finally. */
	FAudio_memcpy(
		pParameters,
		&voice->sendFilter[i],
		sizeof(FAudioFilterParameters)
	);

	FAudio_PlatformUnlockMutex(voice->sendLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
	LOG_API_EXIT(voice->audio)
}